

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syscalls.cpp
# Opt level: O2

int skiwi::_skiwi_write(int fd,void *buffer,uint count)

{
  ssize_t sVar1;
  
  if (-1 < fd) {
    sVar1 = write(fd,buffer,(ulong)count);
    return (int)sVar1;
  }
  return 0;
}

Assistant:

int _skiwi_write(int fd, const void* buffer, unsigned int count)
  {
  if (fd < 0)
    return 0;
#ifdef _WIN32
  return _write(fd, buffer, count);
#else
  return write(fd, buffer, count);
#endif
  }